

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

int Gli_ManCreateNode(Gli_Man_t *p,Vec_Int_t *vFanins,int nFanouts,word *pGateTruth)

{
  int iVar1;
  Gli_Obj_t *pNode;
  int iVar2;
  
  if (0x10 < vFanins->nSize) {
    __assert_fail("Vec_IntSize(vFanins) <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                  ,0x175,"int Gli_ManCreateNode(Gli_Man_t *, Vec_Int_t *, int, word *)");
  }
  pNode = Gli_ObjAlloc(p,vFanins->nSize,nFanouts);
  for (iVar2 = 0; iVar2 < vFanins->nSize; iVar2 = iVar2 + 1) {
    iVar1 = Vec_IntEntry(vFanins,iVar2);
    if (p->pObjData == (int *)0x0) break;
    Gli_ObjAddFanin(pNode,(Gli_Obj_t *)(p->pObjData + iVar1));
  }
  pNode->pTruth = pGateTruth;
  iVar2 = Gli_NodeComputeValue(pNode);
  *(uint *)pNode = (*(uint *)pNode & 0xfffffff9) + iVar2 * 6;
  return pNode->Handle;
}

Assistant:

int Gli_ManCreateNode( Gli_Man_t * p, Vec_Int_t * vFanins, int nFanouts, word * pGateTruth )
{
    Gli_Obj_t * pObj, * pFanin;
    int i;
    assert( Vec_IntSize(vFanins) <= 16 );
    pObj = Gli_ObjAlloc( p, Vec_IntSize(vFanins), nFanouts );
    Gli_ManForEachEntry( vFanins, p, pFanin, i )
        Gli_ObjAddFanin( pObj, pFanin );
    pObj->pTruth = pGateTruth;
    pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
    return pObj->Handle;
}